

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void tlbi_aa64_ipas2e1is_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  if (((env->features & 0x100000000) != 0) && (((env->cp15).scr_el3 & 1) != 0)) {
    tlb_flush_page_by_mmuidx_all_cpus_synced_aarch64
              ((CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14),(long)(value << 0x1c) >> 0x10,0x800);
    return;
  }
  return;
}

Assistant:

static void tlbi_aa64_ipas2e1is_write(CPUARMState *env, const ARMCPRegInfo *ri,
                                      uint64_t value)
{
    CPUState *cs = env_cpu(env);
    uint64_t pageaddr;

    if (!arm_feature(env, ARM_FEATURE_EL2) || !(env->cp15.scr_el3 & SCR_NS)) {
        return;
    }

    pageaddr = sextract64(value << 12, 0, 48);

    tlb_flush_page_by_mmuidx_all_cpus_synced(cs, pageaddr,
                                             ARMMMUIdxBit_Stage2);
}